

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall
chrono::ChArchiveExplorer::out(ChArchiveExplorer *this,ChValue *bVal,bool tracked,size_t obj_ID)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  undefined4 extraout_var;
  byte local_99;
  bool local_89;
  value_type local_78 [3];
  undefined1 local_60 [8];
  string username;
  bool local_29;
  bool matched;
  size_t obj_ID_local;
  bool tracked_local;
  ChValue *bVal_local;
  ChArchiveExplorer *this_local;
  
  if ((((this->found & 1U) == 0) || ((this->find_all & 1U) != 0)) &&
     (iVar3 = this->tablevel,
     sVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->search_tokens), (ulong)(long)iVar3 < sVar4)) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->search_tokens,(long)this->tablevel);
    pcVar6 = ChValue::name(bVal);
    bVar1 = MatchName(this,pvVar5,pcVar6);
    local_89 = true;
    if (!bVar1) {
      local_89 = this->tablevel == 0;
    }
    local_29 = local_89;
    local_99 = 0;
    if ((local_89 == false) && (local_99 = 0, this->tablevel != 0)) {
      join_0x00000010_0x00000000_ =
           std::vector<bool,_std::allocator<bool>_>::operator[]
                     (&this->in_array,(long)this->tablevel);
      bVar1 = std::_Bit_reference::operator_cast_to_bool
                        ((_Bit_reference *)((long)&username.field_2 + 8));
      local_99 = 0;
      if ((bVar1) && (local_99 = 0, (this->use_user_names & 1U) != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->search_tokens,(long)this->tablevel);
        uVar2 = std::__cxx11::string::empty();
        local_99 = 0;
        if ((uVar2 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->search_tokens,(long)this->tablevel);
          pcVar6 = (char *)std::__cxx11::string::front();
          local_99 = 0;
          if (*pcVar6 == '\'') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->search_tokens,(long)this->tablevel);
            pcVar6 = (char *)std::__cxx11::string::back();
            local_99 = 0;
            if (*pcVar6 == '\'') {
              iVar3 = (*bVal->_vptr_ChValue[0xf])();
              local_99 = (byte)iVar3;
            }
          }
        }
      }
    }
    if ((local_99 & 1) != 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->search_tokens,(long)this->tablevel);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->search_tokens,(long)this->tablevel);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_60,(ulong)pvVar5);
      (*bVal->_vptr_ChValue[0x10])();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_29 = MatchName(this,(string *)local_60,pcVar6);
      std::__cxx11::string::~string((string *)local_60);
    }
    if (local_29 != false) {
      this->found_obj = true;
      iVar3 = this->tablevel;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->search_tokens);
      if ((long)(iVar3 + 1) == sVar4) {
        iVar3 = (*bVal->_vptr_ChValue[2])();
        local_78[0] = (value_type)CONCAT44(extraout_var,iVar3);
        std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::push_back
                  (&this->results,local_78);
        this->found = true;
      }
      else {
        this->tablevel = this->tablevel + 1;
        std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,false);
        (*bVal->_vptr_ChValue[0xd])(bVal,this);
        this->tablevel = this->tablevel + -1;
        std::vector<bool,_std::allocator<bool>_>::pop_back(&this->in_array);
      }
    }
  }
  return;
}

Assistant:

virtual void out     (ChValue& bVal, bool tracked, size_t obj_ID) {
            if (this->found && !this->find_all) return;
            if (this->tablevel >= this->search_tokens.size()) return;

            bool matched = this->MatchName(search_tokens[this->tablevel],bVal.name()) || (tablevel==0);
            if (      ! matched 
                        && tablevel
                        && this->in_array[tablevel] 
                        && this->use_user_names 
                        && !search_tokens[this->tablevel].empty()
                        && (search_tokens[this->tablevel].front()==*"'" && search_tokens[this->tablevel].back()==*"'")
                        && bVal.HasArchiveContainerName() ) {
                  std::string username = search_tokens[this->tablevel].substr(1,search_tokens[this->tablevel].length()-2);
                  matched = this->MatchName(username,bVal.CallArchiveContainerName().c_str());
            }

            if (matched) {
                this->found_obj = true;
                if (this->tablevel +1 == this->search_tokens.size()) {
                    this->results.push_back(bVal.new_clone());
                    this->found = true;
                } else {
                    ++tablevel;
                    in_array.push_back(false);
                    bVal.CallArchiveOut(*this);
                    --tablevel;
                    in_array.pop_back();
                }
            }
      }